

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

int xmlSchemaValidateLengthFacetInternal
              (xmlSchemaFacetPtr facet,xmlSchemaValType valType,xmlChar *value,xmlSchemaValPtr val,
              unsigned_long *length,xmlSchemaWhitespaceValueType ws)

{
  xmlSchemaValPtr pxVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  char *discard;
  char *local_20;
  
  if (facet == (xmlSchemaFacetPtr)0x0 || length == (unsigned_long *)0x0) {
    return -1;
  }
  *length = 0;
  if (2 < facet->type - XML_SCHEMA_FACET_LENGTH) {
    return -1;
  }
  pxVar1 = facet->val;
  if (pxVar1 == (xmlSchemaValPtr)0x0) {
    return -1;
  }
  if ((pxVar1->type != XML_SCHEMAS_NNINTEGER) && (pxVar1->type != XML_SCHEMAS_DECIMAL)) {
    return -1;
  }
  if ((pxVar1->value).decimal.fractionalPlaces != 1) {
    return -1;
  }
  if (*(char *)((pxVar1->value).date.year + 2 + (ulong)(pxVar1->value).decimal.integralPlaces) !=
      '0') {
    return -1;
  }
  if ((val != (xmlSchemaValPtr)0x0) &&
     ((val->type == XML_SCHEMAS_BASE64BINARY || (val->type == XML_SCHEMAS_HEXBINARY)))) {
    uVar2 = (val->value).decimal.integralPlaces;
    goto LAB_001acd83;
  }
  uVar2 = 0;
  if (XML_SCHEMAS_ANYURI < valType) goto LAB_001acd83;
  if ((0x21d70000U >> (valType & XML_SCHEMAS_NPINTEGER) & 1) == 0) {
    if ((6U >> (valType & XML_SCHEMAS_NPINTEGER) & 1) == 0) {
      if ((0x10200000U >> (valType & XML_SCHEMAS_NPINTEGER) & 1) != 0) {
        return 0;
      }
      goto LAB_001acd83;
    }
    if (ws == XML_SCHEMA_WHITESPACE_UNKNOWN) {
      if (valType == XML_SCHEMAS_STRING) {
LAB_001ace75:
        uVar2 = xmlUTF8Strlen(value);
        goto LAB_001acd83;
      }
    }
    else {
      if (value == (xmlChar *)0x0) goto LAB_001acd83;
      if (ws != XML_SCHEMA_WHITESPACE_COLLAPSE) goto LAB_001ace75;
    }
  }
  else if (value == (xmlChar *)0x0) goto LAB_001acd83;
  uVar2 = xmlSchemaNormLen(value);
LAB_001acd83:
  uVar4 = (ulong)uVar2;
  *length = uVar4;
  if (facet->type == XML_SCHEMA_FACET_MINLENGTH) {
    if ((facet->val != (xmlSchemaValPtr)0x0) &&
       (uVar3 = strtoul((char *)((facet->val->value).date.year + 1),&local_20,10), uVar4 < uVar3)) {
      return 0x727;
    }
  }
  else if (facet->type == XML_SCHEMA_FACET_LENGTH) {
    if (facet->val == (xmlSchemaValPtr)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = strtoul((char *)((facet->val->value).date.year + 1),&local_20,10);
    }
    if (uVar3 != uVar4) {
      return 0x726;
    }
  }
  else {
    if (facet->val == (xmlSchemaValPtr)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = strtoul((char *)((facet->val->value).date.year + 1),&local_20,10);
    }
    if (uVar3 < uVar4) {
      return 0x728;
    }
  }
  return 0;
}

Assistant:

static int
xmlSchemaValidateLengthFacetInternal(xmlSchemaFacetPtr facet,
				     xmlSchemaValType valType,
				     const xmlChar *value,
				     xmlSchemaValPtr val,
				     unsigned long *length,
				     xmlSchemaWhitespaceValueType ws)
{
    unsigned int len = 0;

    if ((length == NULL) || (facet == NULL))
        return (-1);
    *length = 0;
    if ((facet->type != XML_SCHEMA_FACET_LENGTH) &&
	(facet->type != XML_SCHEMA_FACET_MAXLENGTH) &&
	(facet->type != XML_SCHEMA_FACET_MINLENGTH))
	return (-1);

    /*
    * TODO: length, maxLength and minLength must be of type
    * nonNegativeInteger only. Check if decimal is used somehow.
    */
    if ((facet->val == NULL) ||
	((facet->val->type != XML_SCHEMAS_DECIMAL) &&
	 (facet->val->type != XML_SCHEMAS_NNINTEGER)) ||
	!(xmlSchemaValDecimalIsInteger(&facet->val->value.decimal)))
 {
	return(-1);
    }
    if ((val != NULL) && (val->type == XML_SCHEMAS_HEXBINARY))
	len = val->value.hex.total;
    else if ((val != NULL) && (val->type == XML_SCHEMAS_BASE64BINARY))
	len = val->value.base64.total;
    else {
	switch (valType) {
	    case XML_SCHEMAS_STRING:
	    case XML_SCHEMAS_NORMSTRING:
		if (ws == XML_SCHEMA_WHITESPACE_UNKNOWN) {
		    /*
		    * This is to ensure API compatibility with the old
		    * xmlSchemaValidateLengthFacet(). Anyway, this was and
		    * is not the correct handling.
		    * TODO: Get rid of this case somehow.
		    */
		    if (valType == XML_SCHEMAS_STRING)
			len = xmlUTF8Strlen(value);
		    else
			len = xmlSchemaNormLen(value);
		} else if (value != NULL) {
		    if (ws == XML_SCHEMA_WHITESPACE_COLLAPSE)
			len = xmlSchemaNormLen(value);
		    else
		    /*
		    * Should be OK for "preserve" as well.
		    */
		    len = xmlUTF8Strlen(value);
		}
		break;
	    case XML_SCHEMAS_IDREF:
	    case XML_SCHEMAS_TOKEN:
	    case XML_SCHEMAS_LANGUAGE:
	    case XML_SCHEMAS_NMTOKEN:
	    case XML_SCHEMAS_NAME:
	    case XML_SCHEMAS_NCNAME:
	    case XML_SCHEMAS_ID:
		/*
		* FIXME: What exactly to do with anyURI?
		*/
	    case XML_SCHEMAS_ANYURI:
		if (value != NULL)
		    len = xmlSchemaNormLen(value);
		break;
	    case XML_SCHEMAS_QNAME:
	    case XML_SCHEMAS_NOTATION:
		/*
		* For QName and NOTATION, those facets are
		* deprecated and should be ignored.
		*/
		return (0);
	    default:
		/* TODO */
                break;
	}
    }
    *length = (unsigned long) len;
    /*
    * TODO: Return the whole expected value. (This may be possible now with xmlSchemaValDecimalCompareWithInteger)
    */
    if (facet->type == XML_SCHEMA_FACET_LENGTH) {
        if (len != xmlSchemaGetFacetValueAsULong(facet))
	    return(XML_SCHEMAV_CVC_LENGTH_VALID);
    } else if (facet->type == XML_SCHEMA_FACET_MINLENGTH) {
        if (len < xmlSchemaGetFacetValueAsULong(facet))
	    return(XML_SCHEMAV_CVC_MINLENGTH_VALID);
    } else {
        if (len > xmlSchemaGetFacetValueAsULong(facet))
	    return(XML_SCHEMAV_CVC_MAXLENGTH_VALID);
    }

    return (0);
}